

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O1

void * __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldDefault
          (ReflectionSchema *this,FieldDescriptor *field)

{
  Message *pMVar1;
  long *plVar2;
  uint uVar3;
  FieldDescriptor *local_28;
  _func_void_FieldDescriptor_ptr *local_20;
  
  if (field[0x42] == (FieldDescriptor)0x0) {
    plVar2 = (long *)(*(long *)(field + 0x50) + 0x28);
  }
  else if (*(long *)(field + 0x60) == 0) {
    plVar2 = (long *)(*(long *)(field + 0x28) + 0x80);
  }
  else {
    plVar2 = (long *)(*(long *)(field + 0x60) + 0x50);
  }
  pMVar1 = this->default_instance_;
  uVar3 = this->offsets_[(int)((ulong)((long)field - *plVar2) >> 3) * 0x286bca1b];
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_20 = FieldDescriptor::TypeOnceInit;
    local_28 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_20,&local_28);
  }
  if ((*(int *)(field + 0x38) == 0xc) || (*(int *)(field + 0x38) == 9)) {
    uVar3 = uVar3 & 0xfffffffe;
  }
  return (void *)((long)&(pMVar1->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
}

Assistant:

const void* GetFieldDefault(const FieldDescriptor* field) const {
    return reinterpret_cast<const uint8*>(default_instance_) +
           OffsetValue(offsets_[field->index()], field->type());
  }